

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall S2Polygon::BoundaryNear(S2Polygon *this,S2Polygon *b,S1Angle max_error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  S2Loop *this_00;
  S2Loop *this_01;
  S2Loop *b_loop;
  int j;
  bool success;
  S2Loop *a_loop;
  int i;
  S2Polygon *b_local;
  S2Polygon *this_local;
  S1Angle max_error_local;
  
  iVar3 = num_loops(this);
  iVar4 = num_loops(b);
  if (iVar3 == iVar4) {
    for (a_loop._4_4_ = 0; iVar3 = num_loops(this), a_loop._4_4_ < iVar3;
        a_loop._4_4_ = a_loop._4_4_ + 1) {
      this_00 = loop(this,a_loop._4_4_);
      bVar1 = false;
      for (b_loop._0_4_ = 0; iVar3 = num_loops(this), (int)b_loop < iVar3;
          b_loop._0_4_ = (int)b_loop + 1) {
        this_01 = loop(b,(int)b_loop);
        iVar3 = S2Loop::depth(this_01);
        iVar4 = S2Loop::depth(this_00);
        if ((iVar3 == iVar4) && (bVar2 = S2Loop::BoundaryNear(this_01,this_00,max_error), bVar2)) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        return false;
      }
    }
    max_error_local.radians_._7_1_ = true;
  }
  else {
    max_error_local.radians_._7_1_ = false;
  }
  return max_error_local.radians_._7_1_;
}

Assistant:

bool S2Polygon::BoundaryNear(const S2Polygon& b, S1Angle max_error) const {
  if (num_loops() != b.num_loops()) return false;

  // For now, we assume that there is at most one candidate match for each
  // loop.  (So far this method is just used for testing.)

  for (int i = 0; i < num_loops(); ++i) {
    const S2Loop& a_loop = *loop(i);
    bool success = false;
    for (int j = 0; j < num_loops(); ++j) {
      const S2Loop& b_loop = *b.loop(j);
      if (b_loop.depth() == a_loop.depth() &&
          b_loop.BoundaryNear(a_loop, max_error)) {
        success = true;
        break;
      }
    }
    if (!success) return false;
  }
  return true;
}